

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Any_data _Var1;
  void *pvVar2;
  Communicator client;
  uint local_6c;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  string ip;
  _Any_data __tmp;
  
  printf("Usage: %s ip port\n",*argv);
  if (argc < 3) {
    return -1;
  }
  std::__cxx11::string::string((string *)&ip,"127.0.0.1",(allocator *)local_68._M_pod_data);
  std::__cxx11::string::assign((char *)&ip);
  local_6c = atoi(argv[2]);
  printf("Connecting to %s : %d\n",ip._M_dataplus._M_p,(ulong)local_6c);
  GGSock::Communicator::Communicator(&client,false);
  local_68 = (_Any_data)ZEXT816(0);
  p_Stack_50 = std::
               _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:36:35)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:36:35)>
             ::_M_manager;
  GGSock::Communicator::setMessageCallback((ushort)&client,(function *)0x5f);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_68 = (_Any_data)ZEXT816(0);
  p_Stack_50 = std::
               _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:40:35)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:40:35)>
             ::_M_manager;
  GGSock::Communicator::setMessageCallback((ushort)&client,(function *)0x5e);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68 = (_Any_data)ZEXT816(0);
  pvVar2 = operator_new(0x18);
  *(Communicator **)pvVar2 = &client;
  *(string **)((long)pvVar2 + 8) = &ip;
  *(uint **)((long)pvVar2 + 0x10) = &local_6c;
  local_58 = g_update.super__Function_base._M_manager;
  local_68._M_unused._M_object = pvVar2;
  _Var1 = local_68;
  local_68 = g_update.super__Function_base._M_functor;
  g_update.super__Function_base._M_functor = _Var1;
  g_update.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:45:16)>
       ::_M_manager;
  p_Stack_50 = g_update._M_invoker;
  g_update._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:45:16)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  do {
    update();
    local_68._M_unused._M_member_pointer = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_68);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s ip port\n", argv[0]);
    if (argc < 3) {
        return -1;
    }

    std::string ip = "127.0.0.1";
    int port = 12003;

    if (argc > 1) ip = argv[1];
    if (argc > 2) port = atoi(argv[2]);

    printf("Connecting to %s : %d\n", ip.c_str(), port);

    GGSock::Communicator client(false);

    client.setMessageCallback(95, [](const char * , size_t ) {
        printf("Received message 95\n");
        return 0;
    });
    client.setMessageCallback(94, [](const char * , size_t dataSize) {
        printf("Received message 94, dataSize = %d\n", (int) dataSize);
        return 0;
    });

    g_update = [&]() {
        if (client.connect(ip, port, 0)) {
            printf("Started connecting ...\n");
        }

        if (client.isConnected()) {
            client.send(195);
        }

        client.update();
    };


#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop(update, 0, 1);
#else
    while(true) {
        update();
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
#endif

    return 0;
}